

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bstricmp(const_bstring b0,const_bstring b1)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  int iVar8;
  ulong uVar9;
  __int32_t **pp_Var10;
  ulong uVar11;
  
  iVar8 = -0x8000;
  if ((((b0 != (const_bstring)0x0) && (puVar6 = b0->data, puVar6 != (uchar *)0x0)) &&
      (uVar3 = b0->slen, b1 != (const_bstring)0x0 && -1 < (int)uVar3)) &&
     ((puVar7 = b1->data, puVar7 != (uchar *)0x0 && (uVar4 = b1->slen, -1 < (int)uVar4)))) {
    uVar5 = uVar4;
    if ((uVar4 < uVar3) || (uVar5 = uVar3, puVar6 != puVar7 || uVar3 != uVar4)) {
      uVar9 = (ulong)uVar5;
      uVar11 = 0;
      do {
        if (uVar9 == uVar11) {
          if ((int)uVar5 < (int)uVar3) {
            pp_Var10 = __ctype_tolower_loc();
            if ((char)(*pp_Var10)[puVar6[uVar9]] == '\0') {
              return 0x100;
            }
            return (int)(char)(*pp_Var10)[puVar6[uVar9]];
          }
          if ((int)uVar5 < (int)uVar4) {
            pp_Var10 = __ctype_tolower_loc();
            if ((*pp_Var10)[puVar7[uVar9]] << 0x18 != 0) {
              return -(((*pp_Var10)[puVar7[uVar9]] << 0x18) >> 0x18);
            }
            return -0x100;
          }
          goto LAB_0014543e;
        }
        pp_Var10 = __ctype_tolower_loc();
        pbVar1 = puVar6 + uVar11;
        pbVar2 = puVar7 + uVar11;
        uVar11 = uVar11 + 1;
        iVar8 = (int)(char)(*pp_Var10)[*pbVar1] - (int)(char)(*pp_Var10)[*pbVar2];
      } while (iVar8 == 0);
    }
    else {
LAB_0014543e:
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int bstricmp (const_bstring b0, const_bstring b1) {
int i, v, n;

	if (bdata (b0) == NULL || b0->slen < 0 ||
	    bdata (b1) == NULL || b1->slen < 0) return SHRT_MIN;
	if ((n = b0->slen) > b1->slen) n = b1->slen;
	else if (b0->slen == b1->slen && b0->data == b1->data) return BSTR_OK;

	for (i = 0; i < n; i ++) {
		v  = (char) downcase (b0->data[i])
		   - (char) downcase (b1->data[i]);
		if (0 != v) return v;
	}

	if (b0->slen > n) {
		v = (char) downcase (b0->data[n]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}
	if (b1->slen > n) {
		v = - (char) downcase (b1->data[n]);
		if (v) return v;
		return - (int) (UCHAR_MAX + 1);
	}
	return BSTR_OK;
}